

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int countsize(lua_State *L,int sizearray)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  char *pcVar4;
  lua_Integer nkey;
  int local_18;
  int type;
  int n;
  int sizearray_local;
  lua_State *L_local;
  
  local_18 = 0;
  lua_pushnil(L);
  while (iVar1 = lua_next(L,1), iVar1 != 0) {
    iVar2 = lua_type(L,-2);
    iVar1 = local_18 + 1;
    if (iVar2 == 3) {
      iVar2 = lua_isinteger(L,-2);
      if (iVar2 == 0) {
        lua_tonumberx(L,-2,(int *)0x0);
        luaL_error(L,"Invalid key %f");
      }
      lVar3 = lua_tointegerx(L,-2,(int *)0x0);
      if ((0 < lVar3) && (lVar3 <= sizearray)) {
        iVar1 = local_18;
      }
    }
    else if ((iVar2 != 4) && (iVar2 != 5)) {
      pcVar4 = lua_typename(L,iVar2);
      luaL_error(L,"Invalid key type %s",pcVar4);
    }
    local_18 = iVar1;
    lua_settop(L,-2);
  }
  return local_18;
}

Assistant:

static int
countsize(lua_State *L, int sizearray) {
	int n = 0;
	lua_pushnil(L);
	while (lua_next(L, 1) != 0) {
		int type = lua_type(L, -2);
		++n;
		if (type == LUA_TNUMBER) {
			if (!lua_isinteger(L, -2)) {
				luaL_error(L, "Invalid key %f", lua_tonumber(L, -2));
			}
			lua_Integer nkey = lua_tointeger(L, -2);
			if (nkey > 0 && nkey <= sizearray) {
				--n;
			}
		} else if (type != LUA_TSTRING && type != LUA_TTABLE) {
			luaL_error(L, "Invalid key type %s", lua_typename(L, type));
		}
		lua_pop(L, 1);
	}

	return n;
}